

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall
FormatterTest_RuntimePrecision_Test::TestBody(FormatterTest_RuntimePrecision_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_string_view<char> format_str_18;
  basic_string_view<char> format_str_19;
  basic_string_view<char> format_str_20;
  basic_string_view<char> format_str_21;
  basic_string_view<char> format_str_22;
  basic_string_view<char> format_str_23;
  basic_string_view<char> format_str_24;
  basic_string_view<char> format_str_25;
  basic_string_view<char> format_str_26;
  basic_string_view<char> format_str_27;
  basic_string_view<char> format_str_28;
  basic_string_view<char> format_str_29;
  basic_string_view<char> format_str_30;
  basic_string_view<char> format_str_31;
  basic_string_view<char> format_str_32;
  basic_string_view<char> format_str_33;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_19;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_20;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_21;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_22;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_23;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_24;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_25;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_26;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_27;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_28;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_29;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_30;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_31;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_32;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_33;
  char format_str [256];
  AssertHelper local_ae8 [2];
  undefined1 local_ad8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_aa0;
  undefined1 *local_a98;
  long local_a90;
  undefined8 local_a88;
  undefined1 local_a80 [504];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  undefined8 local_868;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_860;
  undefined8 local_858;
  internal local_848 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_840;
  undefined1 *local_838 [2];
  undefined1 local_828 [16];
  undefined1 *local_818 [2];
  undefined1 local_808 [16];
  undefined1 *local_7f8 [2];
  undefined1 local_7e8 [16];
  undefined1 *local_7d8 [2];
  undefined1 local_7c8 [16];
  undefined1 *local_7b8 [2];
  undefined1 local_7a8 [16];
  undefined1 *local_798 [2];
  undefined1 local_788 [16];
  undefined1 *local_778 [2];
  undefined1 local_768 [16];
  undefined1 *local_758 [2];
  undefined1 local_748 [16];
  undefined1 *local_738 [2];
  undefined1 local_728 [16];
  undefined1 *local_718 [2];
  undefined1 local_708 [16];
  undefined1 *local_6f8 [2];
  undefined1 local_6e8 [16];
  undefined1 *local_6d8 [2];
  undefined1 local_6c8 [16];
  undefined1 *local_6b8 [2];
  undefined1 local_6a8 [16];
  undefined1 *local_698 [2];
  undefined1 local_688 [16];
  undefined1 *local_678 [2];
  undefined1 local_668 [16];
  undefined1 *local_658 [2];
  undefined1 local_648 [16];
  undefined1 *local_638 [2];
  undefined1 local_628 [16];
  undefined1 *local_618 [2];
  undefined1 local_608 [16];
  undefined1 *local_5f8 [2];
  undefined1 local_5e8 [16];
  undefined1 *local_5d8 [2];
  undefined1 local_5c8 [16];
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined1 *local_578 [2];
  undefined1 local_568 [16];
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  undefined1 *local_538 [2];
  undefined1 local_528 [16];
  undefined1 *local_518 [2];
  undefined1 local_508 [16];
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  undefined1 *local_4d8 [2];
  undefined1 local_4c8 [16];
  undefined1 *local_4b8 [2];
  undefined1 local_4a8 [16];
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  undefined1 *local_478 [2];
  undefined1 local_468 [16];
  undefined8 local_458 [2];
  undefined8 local_448 [2];
  undefined8 local_438 [2];
  undefined8 local_428 [2];
  undefined8 local_418 [2];
  undefined8 local_408 [2];
  undefined8 local_3f8 [2];
  undefined8 local_3e8 [2];
  char local_3d8;
  undefined2 auStack_3d7 [2];
  char local_3d3 [251];
  undefined8 local_2d8 [2];
  undefined8 local_2c8;
  undefined8 local_2b8 [2];
  undefined8 local_2a8;
  undefined8 local_298 [2];
  undefined8 local_288;
  undefined8 local_278 [2];
  undefined8 local_268;
  undefined8 local_258 [2];
  undefined8 local_248;
  undefined8 local_238 [2];
  undefined8 local_228;
  undefined8 local_218 [2];
  undefined8 local_208;
  undefined8 local_1f8 [2];
  undefined8 local_1e8;
  undefined8 local_1d8 [2];
  undefined8 local_1c8;
  undefined8 local_1b8 [2];
  undefined8 local_1a8;
  undefined8 local_198 [2];
  undefined8 local_188;
  undefined8 local_178 [2];
  undefined8 local_168;
  undefined8 local_158 [2];
  undefined8 local_148;
  undefined8 local_138 [2];
  undefined8 local_128;
  undefined8 local_118 [2];
  undefined8 local_108;
  undefined8 local_f8 [2];
  undefined8 local_e8;
  undefined8 local_d8 [2];
  undefined8 local_c8;
  undefined8 local_b8 [2];
  undefined8 local_a8;
  undefined8 local_98 [2];
  undefined8 local_88;
  undefined8 local_78 [2];
  undefined8 local_68;
  undefined8 local_58 [2];
  undefined8 local_48;
  
  safe_sprintf<256ul>((char (*) [256])&local_3d8,"{0:.{%u",0xffffffff);
  increment(local_3d3);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(&local_3d8);
      local_458[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_00.size_ = sVar3;
      format_str_00.data_ = &local_3d8;
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_458;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                    ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_00,args,(locale_ref)0x0);
      local_478[0] = local_468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_478[0] != local_468) {
        operator_delete(local_478[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4d6,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar3 = strlen(&local_3d8);
  (&local_3d8 + sVar3)[0] = '}';
  (&local_3d8 + sVar3)[1] = '\0';
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar4 = strlen(&local_3d8);
      local_448[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_01.size_ = sVar4;
      format_str_01.data_ = &local_3d8;
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_448;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_01,args_00,(locale_ref)0x0);
      local_498[0] = local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_498[0] != local_488) {
        operator_delete(local_498[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4da,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  *(undefined2 *)((long)auStack_3d7 + sVar3) = 0x7d;
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      sVar3 = strlen(&local_3d8);
      local_438[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_02.size_ = sVar3;
      format_str_02.data_ = &local_3d8;
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_438;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_02,args_01,(locale_ref)0x0);
      local_4b8[0] = local_4a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_4b8[0] != local_4a8) {
        operator_delete(local_4b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4dd,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"invalid format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_428[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_03.size_ = 5;
      format_str_03.data_ = "{0:.{";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_428;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_03,args_02,(locale_ref)0x0);
      local_4d8[0] = local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_4d8[0] != local_4c8) {
        operator_delete(local_4d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [100])
               "Expected: format(\"{0:.{\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e0,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"cannot switch from manual to automatic argument indexing","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_418[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_04.size_ = 6;
      format_str_04.data_ = "{0:.{}";
      args_03.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_418;
      args_03.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_04,args_03,(locale_ref)0x0);
      local_4f8[0] = local_4e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4f8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_4f8[0] != local_4e8) {
        operator_delete(local_4f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [101])
               "Expected: format(\"{0:.{}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e2,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"invalid format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_408[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_05.size_ = 8;
      format_str_05.data_ = "{0:.{?}}";
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_408;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_05,args_04,(locale_ref)0x0);
      local_518[0] = local_508;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_518,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_518[0] != local_508) {
        operator_delete(local_518[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [103])
               "Expected: format(\"{0:.{?}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e4,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_2d8[0] = 0;
      local_2c8 = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_06.size_ = 7;
      format_str_06.data_ = "{0:.{1}";
      args_05.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_2d8;
      args_05.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_06,args_05,(locale_ref)0x0);
      local_538[0] = local_528;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_538,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_538[0] != local_528) {
        operator_delete(local_538[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [105])
               "Expected: format(\"{0:.{1}\", 0, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e6,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"argument index out of range","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3f8[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_07.size_ = 8;
      format_str_07.data_ = "{0:.{1}}";
      args_06.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_3f8;
      args_06.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_07,args_06,(locale_ref)0x0);
      local_558[0] = local_548;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_558,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_558[0] != local_548) {
        operator_delete(local_558[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [103])
               "Expected: format(\"{0:.{1}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e8,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"invalid format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3e8[0] = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_08.size_ = 9;
      format_str_08.data_ = "{0:.{0:}}";
      args_07.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_3e8;
      args_07.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_08,args_07,(locale_ref)0x0);
      local_578[0] = local_568;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_578,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_578[0] != local_568) {
        operator_delete(local_578[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [104])
               "Expected: format(\"{0:.{0:}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4eb,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"negative precision","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_2b8[0] = 0;
      local_2a8 = 0xffffffff;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_09.size_ = 8;
      format_str_09.data_ = "{0:.{1}}";
      args_08.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_2b8;
      args_08.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_09,args_08,(locale_ref)0x0);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_598,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_598[0] != local_588) {
        operator_delete(local_598[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [107])
               "Expected: format(\"{0:.{1}}\", 0, -1) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ee,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_298[0] = 0;
      local_288 = 0x80000000;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_10.size_ = 8;
      format_str_10.data_ = "{0:.{1}}";
      args_09.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_298;
      args_09.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,unsigned_int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_10,args_09,(locale_ref)0x0);
      local_5b8[0] = local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_5b8[0] != local_5a8) {
        operator_delete(local_5b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [122])
               "Expected: format(\"{0:.{1}}\", 0, (2147483647 + 1u)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f0,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"negative precision","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_278[0] = 0;
      local_268 = 0xffffffffffffffff;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_11.size_ = 8;
      format_str_11.data_ = "{0:.{1}}";
      args_10.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_278;
      args_10.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,long>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_11,args_10,(locale_ref)0x0);
      local_5d8[0] = local_5c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5d8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_5d8[0] != local_5c8) {
        operator_delete(local_5d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, -1l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f2,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_258[0] = 0;
      local_248 = 0x80000000;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_12.size_ = 8;
      format_str_12.data_ = "{0:.{1}}";
      args_11.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_258;
      args_11.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,long>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_12,args_11,(locale_ref)0x0);
      local_5f8[0] = local_5e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5f8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_5f8[0] != local_5e8) {
        operator_delete(local_5f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [116])
               "Expected: format(\"{0:.{1}}\", 0, (value + 1)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f6,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"number is too big","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_238[0] = 0;
      local_228 = 0x80000000;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_13.size_ = 8;
      format_str_13.data_ = "{0:.{1}}";
      args_12.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_238;
      args_12.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,unsigned_long>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_13,args_12,(locale_ref)0x0);
      local_618[0] = local_608;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_618,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_618[0] != local_608) {
        operator_delete(local_618[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [123])
               "Expected: format(\"{0:.{1}}\", 0, (2147483647 + 1ul)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f9,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision is not integer","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_218[0] = 0;
      local_208 = 0x30;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_14.size_ = 8;
      format_str_14.data_ = "{0:.{1}}";
      args_13.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_218;
      args_13.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,char>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_14,args_13,(locale_ref)0x0);
      local_638[0] = local_628;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_638,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_638[0] != local_628) {
        operator_delete(local_638[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, \'0\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4fc,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision is not integer","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1f8[0] = 0;
      local_1e8 = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_15.size_ = 8;
      format_str_15.data_ = "{0:.{1}}";
      args_14.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1f8;
      args_14.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,double>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_15,args_14,(locale_ref)0x0);
      local_658[0] = local_648;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_658,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_658[0] != local_648) {
        operator_delete(local_658[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, 0.0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4fe,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1d8[0] = 0x2a;
      local_1c8 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_16.size_ = 8;
      format_str_16.data_ = "{0:.{1}}";
      args_15.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1d8;
      args_15.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_16,args_15,(locale_ref)0x0);
      local_678[0] = local_668;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_678,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_678[0] != local_668) {
        operator_delete(local_678[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [107])
               "Expected: format(\"{0:.{1}}\", 42, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x501,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_1b8[0] = 0x2a;
      local_1a8 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_17.size_ = 9;
      format_str_17.data_ = "{0:.{1}f}";
      args_16.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_1b8;
      args_16.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_17,args_16,(locale_ref)0x0);
      local_698[0] = local_688;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_698,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_698[0] != local_688) {
        operator_delete(local_698[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}f}\", 42, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x503,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_198[0] = 0x2a;
      local_188 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_18.size_ = 8;
      format_str_18.data_ = "{0:.{1}}";
      args_17.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_198;
      args_17.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_18,args_17,(locale_ref)0x0);
      local_6b8[0] = local_6a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_6b8[0] != local_6a8) {
        operator_delete(local_6b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 42u, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x505,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_178[0] = 0x2a;
      local_168 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_19.size_ = 9;
      format_str_19.data_ = "{0:.{1}f}";
      args_18.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_178;
      args_18.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_19,args_18,(locale_ref)0x0);
      local_6d8[0] = local_6c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6d8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_6d8[0] != local_6c8) {
        operator_delete(local_6d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [109])
               "Expected: format(\"{0:.{1}f}\", 42u, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x507,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_158[0] = 0x2a;
      local_148 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_20.size_ = 8;
      format_str_20.data_ = "{0:.{1}}";
      args_19.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_158;
      args_19.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_20,args_19,(locale_ref)0x0);
      local_6f8[0] = local_6e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6f8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_6f8[0] != local_6e8) {
        operator_delete(local_6f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 42l, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x509,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_138[0] = 0x2a;
      local_128 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_21.size_ = 9;
      format_str_21.data_ = "{0:.{1}f}";
      args_20.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_138;
      args_20.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_21,args_20,(locale_ref)0x0);
      local_718[0] = local_708;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_718,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_718[0] != local_708) {
        operator_delete(local_718[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [109])
               "Expected: format(\"{0:.{1}f}\", 42l, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50b,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_118[0] = 0x2a;
      local_108 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_22.size_ = 8;
      format_str_22.data_ = "{0:.{1}}";
      args_21.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_118;
      args_21.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_22,args_21,(locale_ref)0x0);
      local_738[0] = local_728;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_738,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_738[0] != local_728) {
        operator_delete(local_738[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [109])
               "Expected: format(\"{0:.{1}}\", 42ul, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50d,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_f8[0] = 0x2a;
      local_e8 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_23.size_ = 9;
      format_str_23.data_ = "{0:.{1}f}";
      args_22.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_f8;
      args_22.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_23,args_22,(locale_ref)0x0);
      local_758[0] = local_748;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_758,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_758[0] != local_748) {
        operator_delete(local_758[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [110])
               "Expected: format(\"{0:.{1}f}\", 42ul, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50f,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_d8[0] = 0x2a;
      local_c8 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_24.size_ = 8;
      format_str_24.data_ = "{0:.{1}}";
      args_23.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_d8;
      args_23.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_24,args_23,(locale_ref)0x0);
      local_778[0] = local_768;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_778,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_778[0] != local_768) {
        operator_delete(local_778[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [109])
               "Expected: format(\"{0:.{1}}\", 42ll, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x511,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_b8[0] = 0x2a;
      local_a8 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_25.size_ = 9;
      format_str_25.data_ = "{0:.{1}f}";
      args_24.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_b8;
      args_24.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_25,args_24,(locale_ref)0x0);
      local_798[0] = local_788;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_798,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_798[0] != local_788) {
        operator_delete(local_798[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [110])
               "Expected: format(\"{0:.{1}f}\", 42ll, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x513,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_98[0] = 0x2a;
      local_88 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_26.size_ = 8;
      format_str_26.data_ = "{0:.{1}}";
      args_25.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_98;
      args_25.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_26,args_25,(locale_ref)0x0);
      local_7b8[0] = local_7a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7b8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_7b8[0] != local_7a8) {
        operator_delete(local_7b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [110])
               "Expected: format(\"{0:.{1}}\", 42ull, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x515,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_78[0] = 0x2a;
      local_68 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_27.size_ = 9;
      format_str_27.data_ = "{0:.{1}f}";
      args_26.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_78;
      args_26.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_27,args_26,(locale_ref)0x0);
      local_7d8[0] = local_7c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7d8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_7d8[0] != local_7c8) {
        operator_delete(local_7d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [111])
               "Expected: format(\"{0:.{1}f}\", 42ull, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x517,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 0x78;
      local_48 = 0;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_28.size_ = 9;
      format_str_28.data_ = "{0:3.{1}}";
      args_27.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_27.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_28,args_27,(locale_ref)0x0);
      local_7f8[0] = local_7e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7f8,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_7f8[0] != local_7e8) {
        operator_delete(local_7f8[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [109])
               "Expected: format(\"{0:3.{1}}\", \'x\', 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x519,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_ae8[0].data_ = (AssertHelperData *)0x3ff3c083126e978d;
  local_ad8._0_8_ = 2;
  local_a90 = 0;
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_a88 = 500;
  format_str_29.size_ = 8;
  format_str_29.data_ = "{0:.{1}}";
  args_28.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_ae8;
  args_28.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double,int>
       ::TYPES;
  local_a98 = local_a80;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_aa0,format_str_29,args_28,(locale_ref)0x0);
  paVar1 = &local_ac8.field_2;
  local_ac8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,local_a98,local_a98 + local_a90);
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_a98 != local_a80) {
    operator_delete(local_a98);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_868,"\"1.2\"","format(\"{0:.{1}}\", 1.2345, 2)",
             (char (*) [4])0x2428ed,&local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != paVar1) {
    operator_delete(local_ac8._M_dataplus._M_p);
  }
  if (local_868._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_aa0);
    if (local_860.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_860.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x51a,pcVar5);
    testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
    testing::internal::AssertHelper::~AssertHelper(local_ae8);
    if (((local_aa0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_860,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_ae8[0].data_ = (AssertHelperData *)0x2;
  local_ad8._0_8_ = 0x9e04189374bc6a7f;
  local_ad8._8_2_ = 0x3fff;
  local_a90 = 0;
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_a88 = 500;
  format_str_30.size_ = 8;
  format_str_30.data_ = "{1:.{0}}";
  args_29.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_ae8;
  args_29.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int,long_double>
       ::TYPES;
  local_a98 = local_a80;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_aa0,format_str_30,args_29,(locale_ref)0x0);
  local_ac8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,local_a98,local_a98 + local_a90);
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_a98 != local_a80) {
    operator_delete(local_a98);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_868,"\"1.2\"","format(\"{1:.{0}}\", 2, 1.2345l)",
             (char (*) [4])0x2428ed,&local_ac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != paVar1) {
    operator_delete(local_ac8._M_dataplus._M_p);
  }
  if (local_868._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_aa0);
    if (local_860.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_860.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x51b,pcVar5);
    testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
    testing::internal::AssertHelper::~AssertHelper(local_ae8);
    if (((local_aa0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_860,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_ac8._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_868 = 0xcafe;
      local_858 = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_31.size_ = 8;
      format_str_31.data_ = "{0:.{1}}";
      args_30.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_868;
      args_30.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_31,args_30,(locale_ref)0x0);
      local_818[0] = local_808;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_818,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_818[0] != local_808) {
        operator_delete(local_818[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_ac8,
               (char (*) [136])
               "Expected: format(\"{0:.{1}}\", reinterpret_cast<void*>(0xcafe), 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((pointer)local_ac8._M_string_length == (pointer)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_ac8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x51e,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_ac8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((char)local_888._M_dataplus._M_p == '\x01') {
    local_ae8[0].data_ = (AssertHelperData *)local_ad8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ae8,"precision not allowed for this argument type","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_ac8._M_dataplus._M_p = (pointer)0xcafe;
      local_ac8.field_2._M_allocated_capacity = 2;
      local_a90 = 0;
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_a88 = 500;
      format_str_32.size_ = 9;
      format_str_32.data_ = "{0:.{1}f}";
      args_31.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_ac8;
      args_31.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*,int>
           ::TYPES;
      local_a98 = local_a80;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_aa0,format_str_32,args_31,(locale_ref)0x0);
      local_838[0] = local_828;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_838,local_a98,local_a98 + local_a90);
      local_aa0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_a98 != local_a80) {
        operator_delete(local_a98);
      }
      if (local_838[0] != local_828) {
        operator_delete(local_838[0]);
      }
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_888,
               (char (*) [137])
               "Expected: format(\"{0:.{1}f}\", reinterpret_cast<void*>(0xcafe), 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_ae8[0].data_ != (AssertHelperData *)local_ad8) {
      operator_delete(local_ae8[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_aa0);
  if ((undefined8 *)local_888._M_string_length == (undefined8 *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = *(char **)local_888._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_ae8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x520,pcVar5);
  testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
  testing::internal::AssertHelper::~AssertHelper(local_ae8);
  if (((local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_aa0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_888._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_ae8[0].data_ = (AssertHelperData *)0x2374f3;
  local_ad8._0_8_ = 2;
  local_a90 = 0;
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_a88 = 500;
  format_str_33.size_ = 8;
  format_str_33.data_ = "{0:.{1}}";
  args_32.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_ae8;
  args_32.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4],int>
       ::TYPES;
  local_a98 = local_a80;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_aa0,format_str_33,args_32,(locale_ref)0x0);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,local_a98,local_a98 + local_a90);
  local_aa0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_a98 != local_a80) {
    operator_delete(local_a98);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_848,"\"st\"","format(\"{0:.{1}}\", \"str\", 2)",(char (*) [3])0x235a02,&local_888
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if (local_848[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_aa0);
    if (local_840.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_840.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_ae8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x522,pcVar5);
    testing::internal::AssertHelper::operator=(local_ae8,(Message *)&local_aa0);
    testing::internal::AssertHelper::~AssertHelper(local_ae8);
    if (((local_aa0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_aa0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_aa0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_840,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, RuntimePrecision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.{%u", UINT_MAX);
  increment(format_str + 5);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  format_str[size + 1] = '}';
  format_str[size + 2] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{}", 0),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{0:.{?}}", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{1}", 0, 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0),
      format_error, "argument index out of range");

  EXPECT_THROW_MSG(format("{0:.{0:}}", 0),
      format_error, "invalid format string");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1),
      format_error, "negative precision");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1u)),
      format_error, "number is too big");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1l),
      format_error, "negative precision");
  if (fmt::internal::const_check(sizeof(long) > sizeof(int))) {
    long value = INT_MAX;
    EXPECT_THROW_MSG(format("{0:.{1}}", 0, (value + 1)),
        format_error, "number is too big");
  }
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1ul)),
      format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, '0'),
      format_error, "precision is not integer");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, 0.0),
      format_error, "precision is not integer");

  EXPECT_THROW_MSG(format("{0:.{1}}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.{1}}", 'x', 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.{1}}", 1.2345, 2));
  EXPECT_EQ("1.2", format("{1:.{0}}", 2, 1.2345l));

  EXPECT_THROW_MSG(format("{0:.{1}}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.{1}}", "str", 2));
}